

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O2

void __thiscall bloaty::dwarf::LineInfoReader::SpecialOpcodeAdvance(LineInfoReader *this,uint8_t op)

{
  Advance(this,(ulong)((byte)(op - (this->params_).opcode_base) / (this->params_).line_range));
  return;
}

Assistant:

uint8_t LineInfoReader::AdjustedOpcode(uint8_t op) {
  return op - params_.opcode_base;
}